

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDFace::ReplaceEdgeInArray
          (ON_SubDFace *this,uint fei0,ON_SubDEdge *edge_to_remove,ON_SubDEdge *edge_to_insert)

{
  ushort uVar1;
  ON_SubDEdge *pOVar2;
  ON__UINT_PTR direction;
  ON_SubDEdgePtr OVar3;
  ON__UINT_PTR edir;
  ON_SubDEdgePtr *pOStack_40;
  uint fei;
  ON_SubDEdgePtr *eptr;
  uint face_edge_count;
  ON_SubDEdge *edge_to_insert_local;
  ON_SubDEdge *edge_to_remove_local;
  uint fei0_local;
  ON_SubDFace *this_local;
  
  uVar1 = this->m_edge_count;
  pOStack_40 = this->m_edge4;
  edir._4_4_ = 0;
  while( true ) {
    if ((uVar1 <= edir._4_4_) ||
       ((edir._4_4_ == 4 && (pOStack_40 = this->m_edgex, pOStack_40 == (ON_SubDEdgePtr *)0x0)))) {
      return false;
    }
    if ((fei0 <= edir._4_4_) &&
       (pOVar2 = ON_SubDEdgePtr::Edge(pOStack_40), edge_to_remove == pOVar2)) break;
    edir._4_4_ = edir._4_4_ + 1;
    pOStack_40 = pOStack_40 + 1;
  }
  direction = ON_SubDEdgePtr::EdgeDirection(pOStack_40);
  OVar3 = ON_SubDEdgePtr::Create(edge_to_insert,direction);
  pOStack_40->m_ptr = OVar3.m_ptr;
  return true;
}

Assistant:

bool ON_SubDFace::ReplaceEdgeInArray(
  unsigned int fei0,
  ON_SubDEdge* edge_to_remove,
  ON_SubDEdge* edge_to_insert
)
{
  const unsigned int face_edge_count = m_edge_count;
  ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    if (fei >= fei0 && edge_to_remove == eptr->Edge() )
    {
      const ON__UINT_PTR edir = eptr->EdgeDirection();
      *eptr = ON_SubDEdgePtr::Create(edge_to_insert,edir);
      return true;
    }
  }
  return false;
}